

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.h
# Opt level: O0

void __thiscall CVmObjTadsInhQueue::~CVmObjTadsInhQueue(CVmObjTadsInhQueue *this)

{
  undefined8 *puVar1;
  long in_RDI;
  pfq_page *nxt;
  pfq_page *cur;
  undefined8 local_10;
  
  local_10 = *(undefined8 **)(in_RDI + 0x10);
  while (local_10 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_10;
    free(local_10);
    local_10 = puVar1;
  }
  return;
}

Assistant:

~CVmObjTadsInhQueue()
    {
        pfq_page *cur;
        pfq_page *nxt;

        /* delete all of the allocated pages */
        for (cur = alloc_ ; cur != 0 ; cur = nxt)
        {
            /* remember the next page */
            nxt = cur->nxt;

            /* free this page */
            t3free(cur);
        }
    }